

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  InputTypeSpec *pIVar1;
  Context *pCVar2;
  int vecSize;
  int iVar3;
  DataType DVar4;
  TestNode *pTVar5;
  char *__s;
  long *plVar6;
  ShaderMatrixCase *pSVar7;
  ulong uVar8;
  InputType IVar9;
  long *plVar10;
  size_type *psVar11;
  long lVar12;
  uint uVar13;
  MatrixOp MVar14;
  ulong uVar15;
  bool bVar16;
  string vecMatName;
  ShaderInput scalarIn;
  undefined4 uStack_164;
  long local_160;
  long lStack_158;
  ulong local_150;
  byte local_145;
  Precision local_144;
  TestNode *local_140;
  char local_137;
  char local_136;
  char local_135;
  ShaderInput matIn;
  string baseName;
  ShaderInput otherMatIn;
  undefined4 uStack_ec;
  long local_e8;
  long lStack_e0;
  InputType local_d8;
  DataType local_d4;
  allocator<char> local_cd;
  int local_cc;
  char *local_c8;
  uint local_c0;
  InputType local_bc;
  ShaderInput rowVecIn;
  ShaderInput colVecIn;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  TestNode *local_80;
  InputTypeSpec *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  lVar12 = 0;
  do {
    local_78 = init::reducedInputTypes;
    local_137 = init::ops[lVar12].extendedInputTypeCases;
    if ((bool)local_137 != false) {
      local_78 = init::extendedInputTypes;
    }
    MVar14 = init::ops[lVar12].op;
    uVar15 = (ulong)MVar14;
    local_70 = lVar12;
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::ops[lVar12].name,init::ops[lVar12].desc);
    local_80 = pTVar5;
    tcu::TestNode::addChild((TestNode *)this,pTVar5);
    local_136 = init::ops[lVar12].createInputTypeGroup;
    local_bc = (MVar14 != OP_DIV) + INPUTTYPE_UNIFORM;
    local_c0 = MVar14 - OP_INVERSE;
    uVar8 = 0;
    local_150 = uVar15;
    do {
      local_d8 = local_78[uVar8].type;
      local_140 = local_80;
      local_68 = uVar8;
      if (local_136 != '\0') {
        pIVar1 = local_78 + uVar8;
        pTVar5 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar5,
                   (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pIVar1->name,pIVar1->desc);
        local_140 = pTVar5;
        tcu::TestNode::addChild(local_80,pTVar5);
      }
      IVar9 = local_d8;
      if (local_d8 == INPUTTYPE_DYNAMIC) {
        IVar9 = INPUTTYPE_UNIFORM;
      }
      lVar12 = 0;
      do {
        local_145 = (int)uVar15 == 0x11;
        bVar16 = local_c0 < 2;
        DVar4 = init::matrixTypes[lVar12];
        local_60 = lVar12;
        vecSize = glu::getDataTypeMatrixNumColumns(DVar4);
        iVar3 = glu::getDataTypeMatrixNumRows(DVar4);
        local_d4 = DVar4;
        local_c8 = glu::getDataTypeName(DVar4);
        local_135 = bVar16 && vecSize == iVar3;
        local_145 = local_145 & vecSize == iVar3;
        lVar12 = 0;
        local_cc = iVar3;
        do {
          local_144 = init::precisions[lVar12];
          local_58 = lVar12;
          __s = glu::getPrecisionName(local_144);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&otherMatIn,__s,(allocator<char> *)&local_a0);
          plVar6 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
          scalarIn._0_8_ = &local_160;
          plVar10 = plVar6 + 2;
          if ((long *)*plVar6 == plVar10) {
            local_160 = *plVar10;
            lStack_158 = plVar6[3];
          }
          else {
            local_160 = *plVar10;
            scalarIn._0_8_ = (long *)*plVar6;
          }
          unique0x00012000 = plVar6[1];
          *plVar6 = (long)plVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
          vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar11) {
            vecMatName.field_2._M_allocated_capacity = *psVar11;
            vecMatName.field_2._8_8_ = plVar6[3];
          }
          else {
            vecMatName.field_2._M_allocated_capacity = *psVar11;
            vecMatName._M_dataplus._M_p = (pointer)*plVar6;
          }
          vecMatName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&vecMatName);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar11) {
            baseName.field_2._M_allocated_capacity = *psVar11;
            baseName.field_2._8_8_ = plVar6[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar11;
            baseName._M_dataplus._M_p = (pointer)*plVar6;
          }
          baseName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
            operator_delete(vecMatName._M_dataplus._M_p,vecMatName.field_2._M_allocated_capacity + 1
                           );
          }
          if ((long *)scalarIn._0_8_ != &local_160) {
            operator_delete((void *)scalarIn._0_8_,local_160 + 1);
          }
          if ((long *)otherMatIn._0_8_ != &local_e8) {
            operator_delete((void *)otherMatIn._0_8_,local_e8 + 1);
          }
          matIn.inputType = local_d8;
          matIn.dataType = local_d4;
          matIn.precision = local_144;
          if ((MatrixOp)uVar15 < OP_COMP_MUL) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = local_bc;
            stack0xfffffffffffffe98 = CONCAT44(uStack_164,local_144);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,(MatrixOp)uVar15,true);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            uVar15 = local_150;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,(MatrixOp)uVar15,false);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            uVar15 = local_150;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
              uVar15 = local_150;
            }
          }
          uVar13 = (uint)uVar15;
          if (uVar13 == 2) {
            DVar4 = glu::getDataTypeFloatVec(vecSize);
            colVecIn.inputType = INPUTTYPE_DYNAMIC;
            colVecIn.precision = local_144;
            colVecIn.dataType = DVar4;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            glu::getDataTypeName(DVar4);
            scalarIn._0_8_ = &local_160;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            psVar11 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar11) {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName.field_2._8_8_ = plVar6[3];
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName._M_dataplus._M_p = (pointer)*plVar6;
            }
            vecMatName._M_string_length = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                       &colVecIn,(MatrixOp)local_150,true);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_160) {
              operator_delete((void *)scalarIn._0_8_,local_160 + 1);
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            glu::getDataTypeName(DVar4);
            scalarIn._0_8_ = &local_160;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            pTVar5 = local_140;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            psVar11 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar11) {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName.field_2._8_8_ = plVar6[3];
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName._M_dataplus._M_p = (pointer)*plVar6;
            }
            vecMatName._M_string_length = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                       &colVecIn,(MatrixOp)local_150,false);
            tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_160) {
              operator_delete((void *)scalarIn._0_8_,local_160 + 1);
            }
            DVar4 = glu::getDataTypeFloatVec(local_cc);
            rowVecIn.inputType = INPUTTYPE_DYNAMIC;
            rowVecIn.precision = local_144;
            rowVecIn.dataType = DVar4;
            std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_cd);
            plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
            local_a0 = &local_90;
            plVar10 = plVar6 + 2;
            if ((long *)*plVar6 == plVar10) {
              local_90 = *plVar10;
              lStack_88 = plVar6[3];
            }
            else {
              local_90 = *plVar10;
              local_a0 = (long *)*plVar6;
            }
            local_98 = plVar6[1];
            *plVar6 = (long)plVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            glu::getDataTypeName(DVar4);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
            plVar10 = plVar6 + 2;
            if ((long *)*plVar6 == plVar10) {
              local_e8 = *plVar10;
              lStack_e0 = plVar6[3];
              otherMatIn._0_8_ = &local_e8;
            }
            else {
              local_e8 = *plVar10;
              otherMatIn._0_8_ = (long *)*plVar6;
            }
            unique0x00012000 = plVar6[1];
            *plVar6 = (long)plVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
            scalarIn._0_8_ = &local_160;
            plVar10 = plVar6 + 2;
            if ((long *)*plVar6 == plVar10) {
              local_160 = *plVar10;
              lStack_158 = plVar6[3];
            }
            else {
              local_160 = *plVar10;
              scalarIn._0_8_ = (long *)*plVar6;
            }
            unique0x00012000 = plVar6[1];
            *plVar6 = (long)plVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            psVar11 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar11) {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName.field_2._8_8_ = plVar6[3];
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar11;
              vecMatName._M_dataplus._M_p = (pointer)*plVar6;
            }
            vecMatName._M_string_length = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((long *)scalarIn._0_8_ != &local_160) {
              operator_delete((void *)scalarIn._0_8_,local_160 + 1);
            }
            if ((long *)otherMatIn._0_8_ != &local_e8) {
              operator_delete((void *)otherMatIn._0_8_,local_e8 + 1);
            }
            if (local_a0 != &local_90) {
              operator_delete(local_a0,local_90 + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            scalarIn._0_8_ = &local_160;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                       vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,(char *)scalarIn._0_8_,"Vector-matrix case",&rowVecIn,&matIn,
                       (MatrixOp)local_150,true);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((long *)scalarIn._0_8_ != &local_160) {
              operator_delete((void *)scalarIn._0_8_,local_160 + 1);
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            scalarIn._0_8_ = &local_160;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                       vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,(char *)scalarIn._0_8_,"Vector-matrix case",&rowVecIn,&matIn,
                       (MatrixOp)local_150,false);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((long *)scalarIn._0_8_ != &local_160) {
              operator_delete((void *)scalarIn._0_8_,local_160 + 1);
            }
            uVar13 = (uint)local_150;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if (uVar13 != 2) goto LAB_010ad245;
            iVar3 = 2;
            do {
              DVar4 = glu::getDataTypeMatrix(iVar3,vecSize);
              otherMatIn.dataType = DVar4;
              otherMatIn.inputType = IVar9;
              stack0xffffffffffffff10 = CONCAT44(uStack_ec,local_144);
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              glu::getDataTypeName(DVar4);
              scalarIn._0_8_ = &local_160;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar11 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar11) {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName.field_2._8_8_ = plVar6[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName._M_dataplus._M_p = (pointer)*plVar6;
              }
              vecMatName._M_string_length = plVar6[1];
              *plVar6 = (long)psVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,(MatrixOp)local_150,true);
              tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((long *)scalarIn._0_8_ != &local_160) {
                operator_delete((void *)scalarIn._0_8_,local_160 + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              glu::getDataTypeName(DVar4);
              scalarIn._0_8_ = &local_160;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar11 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar11) {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName.field_2._8_8_ = plVar6[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName._M_dataplus._M_p = (pointer)*plVar6;
              }
              vecMatName._M_string_length = plVar6[1];
              *plVar6 = (long)psVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,(MatrixOp)local_150,false);
              tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              uVar13 = (uint)local_150;
              if ((long *)scalarIn._0_8_ != &local_160) {
                operator_delete((void *)scalarIn._0_8_,local_160 + 1);
              }
              iVar3 = iVar3 + 1;
            } while (iVar3 != 5);
          }
          else {
LAB_010ad245:
            if (uVar13 < 5) {
              otherMatIn.dataType = local_d4;
              otherMatIn.inputType = IVar9;
              stack0xffffffffffffff10 = CONCAT44(uStack_ec,local_144);
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              scalarIn._0_8_ = &local_160;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar11 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar11) {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName.field_2._8_8_ = plVar6[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName._M_dataplus._M_p = (pointer)*plVar6;
              }
              vecMatName._M_string_length = plVar6[1];
              *plVar6 = (long)psVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,(MatrixOp)local_150,true);
              tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((long *)scalarIn._0_8_ != &local_160) {
                operator_delete((void *)scalarIn._0_8_,local_160 + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              scalarIn._0_8_ = &local_160;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar11 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar11) {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName.field_2._8_8_ = plVar6[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar11;
                vecMatName._M_dataplus._M_p = (pointer)*plVar6;
              }
              vecMatName._M_string_length = plVar6[1];
              *plVar6 = (long)psVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,(MatrixOp)local_150,false);
              tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              uVar13 = (uint)local_150;
              if ((long *)scalarIn._0_8_ != &local_160) {
                operator_delete((void *)scalarIn._0_8_,local_160 + 1);
              }
            }
          }
          if ((uVar13 - 9 < 6) || ((int)local_150 == 6)) {
LAB_010ad4ad:
            scalarIn.inputType = INPUTTYPE_LAST;
            scalarIn.dataType = TYPE_LAST;
            stack0xfffffffffffffe98 = CONCAT44(uStack_164,3);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,
                       (MatrixOp)local_150,true);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,
                       (MatrixOp)local_150,false);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            if ((int)local_150 == 5) {
              scalarIn.dataType = glu::getDataTypeFloatVec(local_cc);
              scalarIn.inputType = local_d8;
              stack0xfffffffffffffe98 = CONCAT44(uStack_164,local_144);
              otherMatIn.dataType = glu::getDataTypeFloatVec(vecSize);
              otherMatIn.inputType = IVar9;
              stack0xffffffffffffff10 = CONCAT44(uStack_ec,local_144);
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Vector-vector case",&scalarIn,
                         &otherMatIn,(MatrixOp)local_150,true);
              tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Vector-vector case",&scalarIn,
                         &otherMatIn,(MatrixOp)local_150,false);
              tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((uVar13 - 9 < 6) || ((int)local_150 == 6)) goto LAB_010ad4ad;
            }
            if (local_135 != '\0') goto LAB_010ad4ad;
          }
          MVar14 = (MatrixOp)local_150;
          if (((MVar14 < OP_LAST) &&
              ((0x58000U >> (MVar14 & (OP_SUBTRACT_FROM|OP_ADD_INTO)) & 1) != 0)) ||
             (local_145 != 0)) {
            scalarIn.dataType = local_d4;
            scalarIn.inputType = IVar9;
            stack0xfffffffffffffe98 = CONCAT44(uStack_164,local_144);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,MVar14,true);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            uVar15 = local_150;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar2,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,(MatrixOp)uVar15,false);
            tcu::TestNode::addChild(local_140,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
          }
          uVar15 = local_150;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          lVar12 = local_58 + 1;
        } while (lVar12 != 3);
        lVar12 = local_60 + 1;
      } while (lVar12 != 9);
    } while ((local_68 < 2) && (uVar8 = local_68 + 1, local_137 != '\0'));
    lVar12 = local_70 + 1;
    if (lVar12 == 0x13) {
      return 0x13;
    }
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
		bool			createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}